

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateFrequency(Operator *this)

{
  byte bVar1;
  uint uVar2;
  Bit32u block;
  Bit32u freq;
  Operator *this_local;
  
  uVar2 = this->chanData & 0x3ff;
  bVar1 = (byte)(this->chanData >> 10);
  this->waveAdd = (uVar2 << (bVar1 & 0x1f)) * this->freqMul;
  if ((this->reg20 & 0x40) == 0) {
    this->vibStrength = '\0';
    this->vibrato = 0;
  }
  else {
    this->vibStrength = (Bit8u)(uVar2 >> 7);
    this->vibrato = ((uint)this->vibStrength << (bVar1 & 0x1f)) * this->freqMul;
  }
  return;
}

Assistant:

void Operator::UpdateFrequency(  ) {
	Bit32u freq = chanData & (( 1 << 10 ) - 1);
	Bit32u block = (chanData >> 10) & 0xff;
#ifdef WAVE_PRECISION
	block = 7 - block;
	waveAdd = ( freq * freqMul ) >> block;
#else
	waveAdd = ( freq << block ) * freqMul;
#endif
	if ( reg20 & MASK_VIBRATO ) {
		vibStrength = (Bit8u)(freq >> 7);

#ifdef WAVE_PRECISION
		vibrato = ( vibStrength * freqMul ) >> block;
#else
		vibrato = ( vibStrength << block ) * freqMul;
#endif
	} else {
		vibStrength = 0;
		vibrato = 0;
	}
}